

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.hpp
# Opt level: O3

bool njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
     compare<ranges::ref_view<std::vector<long,std::allocator<long>>const>>
               (ref_view<const_std::vector<long,_std::allocator<long>_>_> *left,
               ref_view<const_std::vector<long,_std::allocator<long>_>_> *right)

{
  iter_difference_t<iterator_t<zip_with_view<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_TabulatedBackgroundRMatrix_src_verify_hpp:6:20),_ref_view<const_vector<long,_allocator<long>_>_>,_ref_view<const_vector<long,_allocator<long>_>_>_>_>_>
  iVar1;
  
  iVar1 = ranges::count_fn::
          operator()<ranges::zip_with_view<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_RMatrixLimited_TabulatedBackgroundRMatrix_src_verify_hpp:6:20),_ranges::ref_view<const_std::vector<long,_std::allocator<long>_>_>,_ranges::ref_view<const_std::vector<long,_std::allocator<long>_>_>_>,_bool,_ranges::identity,_true,_0,_0>
                    ((count_fn *)&ranges::count);
  return iVar1 == (long)(left->rng_->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(left->rng_->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3;
}

Assistant:

static bool compare( const Range& left, const Range& right ) {

  return ranges::cpp20::count(
               ranges::views::zip_with(
                   [] ( double left, double right ) { return left == right; },
                   left, right ), true ) == ranges::cpp20::distance( left );
}